

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O2

word Gia_ManAutomSim0(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Wrd_t *vTemp)

{
  long lVar1;
  int i;
  word wVar2;
  
  lVar1 = *(long *)pObj;
  i = Gia_ObjFaninId0p(p,pObj);
  wVar2 = Vec_WrdEntry(vTemp,i);
  return wVar2 ^ (lVar1 << 0x22) >> 0x3f;
}

Assistant:

static inline word Gia_ManAutomSim0( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Wrd_t * vTemp )
{
    return Gia_ObjFaninC0(pObj) ? ~Vec_WrdEntry(vTemp, Gia_ObjFaninId0p(p, pObj)) : Vec_WrdEntry(vTemp, Gia_ObjFaninId0p(p, pObj));
}